

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_table_as_nested_root
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              char *fid,uint16_t align,flatcc_table_verifier_f *tvf)

{
  uint end;
  int iVar1;
  uint *puVar2;
  undefined6 in_register_00000082;
  ulong elem_size;
  flatbuffers_uoffset_t *buf;
  
  elem_size = CONCAT62(in_register_00000082,align) & 0xffffffff;
  iVar1 = flatcc_verify_vector_field(td,id,required,elem_size,1,0xffffffff);
  if (iVar1 != 0) {
    iVar1 = flatcc_verify_vector_field(td,id,required,elem_size,1,0xffffffff);
    return iVar1;
  }
  puVar2 = (uint *)get_field_ptr(td,id);
  if (puVar2 == (uint *)0x0) {
    iVar1 = 0;
  }
  else {
    end = *(uint *)((ulong)*puVar2 + (long)puVar2);
    buf = (flatbuffers_uoffset_t *)((long)puVar2 + (ulong)*puVar2 + 4);
    iVar1 = flatcc_verify_buffer_header(buf,(ulong)end,fid);
    if (iVar1 == 0) {
      iVar1 = verify_table(buf,end,0,*buf,td->ttl,tvf);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int flatcc_verify_table_as_nested_root(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, const char *fid,
        uint16_t align, flatcc_table_verifier_f tvf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    check_result(flatcc_verify_vector_field(td, id, required, align, 1, FLATBUFFERS_COUNT_MAX(1)));
    if (0 == (buf = get_field_ptr(td, id))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    bufsiz = read_uoffset(buf, 0);
    ++buf;
    /*
     * Don't verify nested buffers identifier - information is difficult to get and
     * might not be what is desired anyway. User can do it later.
     */
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_table(buf, bufsiz, 0, read_uoffset(buf, 0), td->ttl, tvf);
}